

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_getter.cpp
# Opt level: O0

void GetAllCaptureMovements(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  int i_6;
  int capture_row_1;
  int j_3;
  int capture_col_1;
  int j_2;
  int row_1;
  int col_1;
  int i_5;
  int capture_row;
  int j_1;
  int capture_col;
  int j;
  int row;
  int col;
  int i_4;
  int horse_leg;
  int i_3;
  int bishop_eye;
  int i_2;
  int i_1;
  int i;
  int piece_to_id;
  int can_move_counter;
  int piece_to;
  int piece_from;
  int player;
  int player_flag;
  int local_84;
  int in_stack_ffffffffffffff84;
  int local_74;
  int local_68;
  int local_60;
  int local_58;
  int local_4c;
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  
  iVar5 = GetPlayerFlag(*in_RDI);
  iVar4 = *in_RDI;
  for (local_34 = iVar5; local_38 = iVar5, local_34 <= iVar5; local_34 = local_34 + 1) {
    if (*(char *)((long)in_RDI + (long)local_34 + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_34 + 0x104);
      local_2c = 0;
      local_28 = KING_CAN_GET[(int)(uint)bVar1][iVar4][0];
      while (local_28 != 0) {
        cVar2 = *(char *)((long)in_RDI + (long)local_28 + 4);
        if ((cVar2 != '\0') && (iVar6 = ColorOfPiece(in_stack_ffffffffffffff84), iVar6 != iVar4)) {
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 2) = cVar2;
          *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)local_28;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
          *in_RSI = *in_RSI + 1;
        }
        local_2c = local_2c + 1;
        local_28 = KING_CAN_GET[(int)(uint)bVar1][iVar4][local_2c];
      }
    }
  }
  while (local_38 = local_38 + 1, local_38 <= iVar5 + 2) {
    if (*(char *)((long)in_RDI + (long)local_38 + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_38 + 0x104);
      local_2c = 0;
      local_28 = ADVISOR_CAN_GET[(int)(uint)bVar1][iVar4][0];
      while (local_28 != 0) {
        cVar2 = *(char *)((long)in_RDI + (long)local_28 + 4);
        if ((cVar2 != '\0') && (iVar6 = ColorOfPiece(in_stack_ffffffffffffff84), iVar6 != iVar4)) {
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 2) = cVar2;
          *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)local_28;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
          *in_RSI = *in_RSI + 1;
        }
        local_2c = local_2c + 1;
        local_28 = ADVISOR_CAN_GET[(int)(uint)bVar1][iVar4][local_2c];
      }
    }
  }
  for (local_3c = iVar5 + 3; local_3c <= iVar5 + 4; local_3c = local_3c + 1) {
    if (*(char *)((long)in_RDI + (long)local_3c + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_3c + 0x104);
      uVar8 = (uint)bVar1;
      local_2c = 0;
      local_28 = BISHOP_CAN_GET[(int)uVar8][iVar4][0];
      while (local_28 != 0) {
        iVar6 = BISHOP_EYE[(int)uVar8][iVar4][local_2c];
        cVar2 = *(char *)((long)in_RDI + (long)local_28 + 4);
        if (((cVar2 != '\0') && (iVar7 = ColorOfPiece(in_stack_ffffffffffffff84), iVar7 != iVar4))
           && (*(char *)((long)in_RDI + (long)iVar6 + 4) == '\0')) {
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 2) = cVar2;
          *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)local_28;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
          *in_RSI = *in_RSI + 1;
        }
        local_2c = local_2c + 1;
        local_28 = BISHOP_CAN_GET[(int)uVar8][iVar4][local_2c];
      }
    }
  }
  for (local_44 = iVar5 + 5; local_44 <= iVar5 + 6; local_44 = local_44 + 1) {
    if (*(char *)((long)in_RDI + (long)local_44 + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_44 + 0x104);
      uVar8 = (uint)bVar1;
      local_2c = 0;
      local_28 = HORSE_CAN_GET[(int)uVar8][0];
      while (local_28 != 0) {
        iVar6 = HORSE_LEG[(int)uVar8][local_2c];
        cVar2 = *(char *)((long)in_RDI + (long)local_28 + 4);
        if (((cVar2 != '\0') && (iVar7 = ColorOfPiece(in_stack_ffffffffffffff84), iVar7 != iVar4))
           && (*(char *)((long)in_RDI + (long)iVar6 + 4) == '\0')) {
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 2) = cVar2;
          *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)local_28;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
          *in_RSI = *in_RSI + 1;
        }
        local_2c = local_2c + 1;
        local_28 = HORSE_CAN_GET[(int)uVar8][local_2c];
      }
    }
  }
  for (local_4c = iVar5 + 7; local_4c <= iVar5 + 8; local_4c = local_4c + 1) {
    if (*(char *)((long)in_RDI + (long)local_4c + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_4c + 0x104);
      uVar8 = GetCol((uint)bVar1);
      uVar9 = GetRow((uint)bVar1);
      for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
        uVar10 = (uint)*(byte *)((long)(int)(uVar8 - 3) * 0x1000 +
                                 (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar9 * 2 + 0x134) * 8
                                 + 0x313d82 + (long)local_58);
        if (uVar10 != uVar8) {
          iVar6 = GetPosition(uVar10,uVar9);
          uVar3 = *(undefined1 *)((long)in_RDI + (long)iVar6 + 4);
          iVar7 = ColorOfPiece(in_stack_ffffffffffffff84);
          if (iVar7 != iVar4) {
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 2) = uVar3;
            *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
            *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)iVar6;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
            *in_RSI = *in_RSI + 1;
          }
        }
      }
      for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
        uVar10 = (uint)*(byte *)((long)(int)(uVar9 - 3) * 0x2000 +
                                 (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar8 * 2 + 0x154) * 8
                                 + 0x31cd82 + (long)local_60);
        if (uVar10 != uVar9) {
          iVar6 = GetPosition(uVar8,uVar10);
          uVar3 = *(undefined1 *)((long)in_RDI + (long)iVar6 + 4);
          iVar7 = ColorOfPiece(in_stack_ffffffffffffff84);
          if (iVar7 != iVar4) {
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 2) = uVar3;
            *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
            *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)iVar6;
            *in_RSI = *in_RSI + 1;
          }
        }
      }
    }
  }
  for (local_68 = iVar5 + 9; local_68 <= iVar5 + 10; local_68 = local_68 + 1) {
    if (*(char *)((long)in_RDI + (long)local_68 + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_68 + 0x104);
      uVar8 = GetCol((uint)bVar1);
      uVar9 = GetRow((uint)bVar1);
      for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
        uVar10 = (uint)*(byte *)((long)(int)(uVar8 - 3) * 0x1000 +
                                 (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar9 * 2 + 0x134) * 8
                                 + 0x313d84 + (long)local_74);
        if (uVar10 != uVar8) {
          iVar6 = GetPosition(uVar10,uVar9);
          uVar3 = *(undefined1 *)((long)in_RDI + (long)iVar6 + 4);
          iVar7 = ColorOfPiece(in_stack_ffffffffffffff84);
          if (iVar7 != iVar4) {
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 2) = uVar3;
            *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
            *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)iVar6;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
            *in_RSI = *in_RSI + 1;
          }
        }
      }
      for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < 2;
          in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
        uVar10 = (uint)*(byte *)((long)(int)(uVar9 - 3) * 0x2000 +
                                 (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar8 * 2 + 0x154) * 8
                                 + 0x31cd84 + (long)in_stack_ffffffffffffff84);
        if (uVar10 != uVar9) {
          iVar6 = GetPosition(uVar8,uVar10);
          uVar3 = *(undefined1 *)((long)in_RDI + (long)iVar6 + 4);
          iVar7 = ColorOfPiece(in_stack_ffffffffffffff84);
          if (iVar7 != iVar4) {
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 2) = uVar3;
            *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
            *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)iVar6;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
            *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
            *in_RSI = *in_RSI + 1;
          }
        }
      }
    }
  }
  for (local_84 = iVar5 + 0xb; local_84 <= iVar5 + 0xf; local_84 = local_84 + 1) {
    if (*(char *)((long)in_RDI + (long)local_84 + 0x104) != '\0') {
      bVar1 = *(byte *)((long)in_RDI + (long)local_84 + 0x104);
      local_2c = 0;
      local_28 = PAWN_CAN_GET[(int)(uint)bVar1][iVar4][0];
      while (local_28 != 0) {
        cVar2 = *(char *)((long)in_RDI + (long)local_28 + 4);
        if ((cVar2 != '\0') && (iVar6 = ColorOfPiece(in_stack_ffffffffffffff84), iVar6 != iVar4)) {
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 2) = cVar2;
          *(byte *)(in_RDX + (long)*in_RSI * 0xc) = bVar1;
          *(char *)(in_RDX + (long)*in_RSI * 0xc + 1) = (char)local_28;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 8) = 0;
          *(undefined1 *)(in_RDX + (long)*in_RSI * 0xc + 9) = 0;
          *in_RSI = *in_RSI + 1;
        }
        local_2c = local_2c + 1;
        local_28 = PAWN_CAN_GET[(int)(uint)bVar1][iVar4][local_2c];
      }
    }
  }
  return;
}

Assistant:

void GetAllCaptureMovements(const Situation & situation, int & num_of_all_movements, Movement* all_movements){
    // 1. 获得玩家特征值 
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_from, piece_to, can_move_counter, piece_to_id;
    // 2. 将(帅)的吃子着法
    for(int i = player_flag + 0; i <= player_flag + 0; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 3. 士(仕)的吃子着法
    for(int i = player_flag + 1; i <= player_flag + 2; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
    // 4. 象(相)的吃子着法
    for(int i = player_flag + 3; i <= player_flag + 4; i ++){
        if(situation.current_pieces[i] != 0){
            int bishop_eye;                  // 象眼位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                bishop_eye = BISHOP_EYE[piece_from][player][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[bishop_eye] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 5. 马的吃子着法
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        if(situation.current_pieces[i] != 0){
            int horse_leg;                  // 马腿位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            while(piece_to != 0){
                horse_leg = HORSE_LEG[piece_from][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[horse_leg] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].movec = 0;
                    all_movements[num_of_all_movements].catc = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            }
        }
    }

    // 6. 车的吃子着法
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].rook_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].rook_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].movec = 0;
                        all_movements[num_of_all_movements].to = piece_to;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }
    
    // 7. 炮的吃子着法
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].cannon_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].cannon_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }

    // 8. 兵(卒)的吃子着法
    for(int i = player_flag + 11; i <= player_flag + 15; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
}